

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O3

FilterInfo * __thiscall
helics::FilterFederate::getFilterInfo
          (FilterFederate *this,GlobalFederateId fed,InterfaceHandle handle)

{
  BaseType BVar1;
  const_iterator cVar2;
  _Head_base<0UL,_helics::FilterInfo_*,_false> _Var3;
  key_type local_10;
  
  BVar1 = (this->mFedID).gid;
  local_10.fed_id.gid = fed.gid;
  if ((this->mCoreID).gid == fed.gid) {
    local_10.fed_id.gid = BVar1;
  }
  if (fed.gid == 0) {
    local_10.fed_id.gid = BVar1;
  }
  local_10.handle.hid = handle.hid;
  cVar2 = std::
          _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->filters).lookup._M_h,&local_10);
  if (cVar2.super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
      _M_cur == (__node_type *)0x0) {
    _Var3._M_head_impl = (FilterInfo *)0x0;
  }
  else {
    _Var3._M_head_impl =
         *(FilterInfo **)
          &(this->filters).dataStorage.
           super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [*(long *)((long)cVar2.
                            super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                            ._M_cur + 0x10)]._M_t.
           super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>;
  }
  return _Var3._M_head_impl;
}

Assistant:

FilterInfo* FilterFederate::getFilterInfo(GlobalFederateId fed, InterfaceHandle handle)
{
    if (fed == parent_broker_id || fed == mCoreID) {
        fed = mFedID;
    }
    return filters.find(GlobalHandle{fed, handle});
}